

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O0

void QPDF::trim_user_password(string *user_password)

{
  int iVar1;
  string local_60 [32];
  long local_40;
  size_t local_38;
  size_t idx;
  char *p2;
  char *p1;
  size_t len;
  char *cstr;
  string *user_password_local;
  
  cstr = (char *)user_password;
  len = std::__cxx11::string::c_str();
  p1 = (char *)std::__cxx11::string::length();
  if ((char *)0x1f < p1) {
    p2 = (char *)len;
    idx = 0;
    while (idx = (size_t)strchr(p2,0x28), (char *)idx != (char *)0x0) {
      local_40 = idx - len;
      local_38 = toS<long>(&local_40);
      iVar1 = memcmp((void *)idx,padding_string,(long)p1 - local_38);
      if (iVar1 == 0) {
        std::__cxx11::string::substr((ulong)local_60,(ulong)cstr);
        std::__cxx11::string::operator=((string *)cstr,local_60);
        std::__cxx11::string::~string(local_60);
        return;
      }
      QTC::TC("qpdf","QPDF_encryption skip 0x28",0);
      p2 = (char *)(idx + 1);
    }
  }
  return;
}

Assistant:

void
QPDF::trim_user_password(std::string& user_password)
{
    // Although unnecessary, this routine trims the padding string from the end of a user password.
    // Its only purpose is for recovery of user passwords which is done in the test suite.
    char const* cstr = user_password.c_str();
    size_t len = user_password.length();
    if (len < key_bytes) {
        return;
    }

    char const* p1 = cstr;
    char const* p2 = nullptr;
    while ((p2 = strchr(p1, '\x28')) != nullptr) {
        size_t idx = toS(p2 - cstr);
        if (memcmp(p2, padding_string, len - idx) == 0) {
            user_password = user_password.substr(0, idx);
            return;
        } else {
            QTC::TC("qpdf", "QPDF_encryption skip 0x28");
            p1 = p2 + 1;
        }
    }
}